

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  Instruction *pIVar5;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  pointer puVar6;
  pointer puVar7;
  Instruction *pIVar8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  
  this_00._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((this_00._M_head_impl == (Instruction *)0x0) ||
     (bVar3 = Instruction::WhileEachInst(this_00._M_head_impl,f,run_on_debug_line_insts), bVar3)) {
    puVar6 = (this->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar6 == puVar1) {
        pIVar5 = (this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar5 != (Instruction *)0x0) &&
           ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
          pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::front
                             (&(this->debug_insts_in_header_).
                               super_IntrusiveList<spvtools::opt::Instruction>);
          while (pIVar5 != (Instruction *)0x0) {
            pIVar8 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            if ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
            {
              pIVar8 = (Instruction *)0x0;
            }
            bVar3 = Instruction::WhileEachInst(pIVar5,f,run_on_debug_line_insts);
            pIVar5 = pIVar8;
            if (!bVar3) {
              return false;
            }
          }
        }
        puVar7 = (this->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (this->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (puVar7 == puVar2) {
            pIVar5 = (this->end_inst_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            if (pIVar5 == (Instruction *)0x0) {
              if (!run_on_non_semantic_insts) {
                return true;
              }
            }
            else {
              bVar3 = Instruction::WhileEachInst(pIVar5,f,run_on_debug_line_insts);
              if (!bVar3 || !run_on_non_semantic_insts) {
                return bVar3;
              }
            }
            puVar6 = (this->non_semantic_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (this->non_semantic_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            do {
              bVar3 = puVar6 == puVar1;
              if (bVar3) {
                return bVar3;
              }
              bVar4 = Instruction::WhileEachInst
                                ((puVar6->_M_t).
                                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                 _M_head_impl,f,run_on_debug_line_insts);
              puVar6 = puVar6 + 1;
            } while (bVar4);
            return bVar3;
          }
          bVar3 = BasicBlock::WhileEachInst
                            ((puVar7->_M_t).
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                             ,f,run_on_debug_line_insts);
          puVar7 = puVar7 + 1;
        } while (bVar3);
        return false;
      }
      bVar3 = Instruction::WhileEachInst
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,f,
                         run_on_debug_line_insts);
      puVar6 = puVar6 + 1;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) {
  if (def_inst_) {
    if (!def_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (auto& param : params_) {
    if (!param->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (!debug_insts_in_header_.empty()) {
    Instruction* di = &debug_insts_in_header_.front();
    while (di != nullptr) {
      Instruction* next_instruction = di->NextNode();
      if (!di->WhileEachInst(f, run_on_debug_line_insts)) return false;
      di = next_instruction;
    }
  }

  for (auto& bb : blocks_) {
    if (!bb->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!end_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!non_semantic->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}